

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::do_remove(tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            *this,key_type k,bool bypass_verifier)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  __extent_storage<18446744073709551615UL> val1;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_00;
  span<const_std::byte,_18446744073709551615UL> key;
  key_type key_00;
  AssertHelper local_398;
  Message local_390;
  unsigned_long local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  __int_type leaf_count_after;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_8;
  __int_type mem_use_after;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  Message local_190;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_188;
  pointer pbStack_180;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_178;
  pointer pbStack_170;
  __int_type local_160;
  __int_type key_prefix_splits_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> shrinking_inodes_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> growing_inodes_before;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  __int_type mem_use_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> node_counts_before;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [24];
  size_type remove_result;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *ptStack_20;
  bool bypass_verifier_local;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  key_type k_local;
  
  k_local._M_ptr = (pointer)k._M_extent._M_extent_value;
  this_local = (tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)k._M_ptr;
  remove_result._7_1_ = bypass_verifier;
  ptStack_20 = this;
  if (!bypass_verifier) {
    key_00._M_extent._M_extent_value = (size_t)this_local;
    key_00._M_ptr = (pointer)this;
    to_ikey((tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *)local_40,key_00);
    sVar3 = std::
            map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::erase(&this->values,(key_type *)local_40);
    std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>::~shared_ptr
              ((shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_40);
    local_7c = 1;
    local_40._16_8_ = sVar3;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_78,"(remove_result)","(1)",(unsigned_long *)(local_40 + 0x10),
               &local_7c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_88);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x121,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::Message::~Message(&local_88);
    }
    node_counts_before._M_elems[4]._5_3_ = 0;
    node_counts_before._M_elems[4]._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (node_counts_before._M_elems[4]._4_4_ != 0) {
      return;
    }
  }
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_node_counts((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *)
                    &mem_use_before,&this->test_db);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         ::get_current_memory_use(&this->test_db);
  pvVar5 = std::array<unsigned_long,_5UL>::operator[]
                     ((array<unsigned_long,_5UL> *)&mem_use_before,0);
  local_dc = 0;
  testing::internal::CmpHelperGT<unsigned_long,int>
            ((internal *)local_d8,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",pvVar5,
             &local_dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  node_counts_before._M_elems[4]._5_3_ = 0;
  node_counts_before._M_elems[4]._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if (node_counts_before._M_elems[4]._4_4_ == 0) {
    local_104 = 0;
    val1._M_extent_value = (size_t)&gtest_ar_1.message_;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_100,"(mem_use_before)","(0)",(unsigned_long *)val1._M_extent_value,
               &local_104);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      val1._M_extent_value = 0x128;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),&local_110);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3));
      testing::Message::~Message(&local_110);
    }
    node_counts_before._M_elems[4]._5_3_ = 0;
    node_counts_before._M_elems[4]._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (node_counts_before._M_elems[4]._4_4_ == 0) {
      this_00 = &this->test_db;
      olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::get_growing_inode_counts
                ((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *)
                 (shrinking_inodes_before._M_elems + 3),this_00);
      olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::get_shrinking_inode_counts
                ((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *)
                 &key_prefix_splits_before,this_00);
      local_160 = olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::get_key_prefix_splits(this_00);
      local_178 = this_local;
      pbStack_170 = k_local._M_ptr;
      uVar2 = olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::remove(this_00,(char *)this_local);
      if ((uVar2 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"test_db.remove failed for ");
        local_188 = this_local;
        pbStack_180 = k_local._M_ptr;
        key._M_extent._M_extent_value = val1._M_extent_value;
        key._M_ptr = k_local._M_ptr;
        unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                  ((detail *)&std::cerr,(ostream *)this_local,key);
        std::operator<<((ostream *)&std::cerr,'\n');
        olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        ::dump(&this->test_db,(ostream *)&std::cerr);
        testing::Message::Message(&local_190);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x135,"Failed");
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_190);
      }
      else if ((this->parallel_test & 1U) == 0) {
        gtest_ar_8.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::get_current_memory_use(&this->test_db);
        testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                  ((internal *)local_358,"(mem_use_after)","(mem_use_before)",
                   (unsigned_long *)&gtest_ar_8.message_,(unsigned_long *)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
        if (!bVar1) {
          testing::Message::Message(&local_360);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&leaf_count_after,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x14c,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_count_after,&local_360);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_count_after);
          testing::Message::~Message(&local_360);
        }
        node_counts_before._M_elems[4]._5_3_ = 0;
        node_counts_before._M_elems[4]._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
        if (node_counts_before._M_elems[4]._4_4_ == 0) {
          gtest_ar_9.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                 ::get_node_count<(unodb::node_type)0>(&this->test_db);
          pvVar5 = std::array<unsigned_long,_5UL>::operator[]
                             ((array<unsigned_long,_5UL> *)&mem_use_before,0);
          local_388 = *pvVar5 - 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_380,"(leaf_count_after)",
                     "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",
                     (unsigned_long *)&gtest_ar_9.message_,&local_388);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
          if (!bVar1) {
            testing::Message::Message(&local_390);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
            testing::internal::AssertHelper::AssertHelper
                      (&local_398,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                       ,0x151,pcVar4);
            testing::internal::AssertHelper::operator=(&local_398,&local_390);
            testing::internal::AssertHelper::~AssertHelper(&local_398);
            testing::Message::~Message(&local_390);
          }
          node_counts_before._M_elems[4]._5_3_ = 0;
          node_counts_before._M_elems[4]._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
        }
      }
    }
  }
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }